

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O0

vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_> *
obj::load_from_file<double>
          (vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>
           *__return_storage_ptr__,string *file)

{
  bool bVar1;
  long local_220;
  ifstream is;
  string *file_local;
  
  std::ifstream::ifstream(&local_220,(string *)file,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (bVar1) {
    load_from_stream<double>(__return_storage_ptr__,(istream *)&local_220);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>::vector
              (__return_storage_ptr__);
  }
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_file(const std::string& file) {
    std::ifstream is(file);
    if (is)
        return load_from_stream<T>(is);
    return std::vector<Tri<T, 3>>();
}